

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_config.cc
# Opt level: O2

shared_ptr<QPDFJob::PagesConfig> __thiscall QPDFJob::Config::pages(Config *this)

{
  element_type *peVar1;
  PagesConfig *__p;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Config *in_RSI;
  shared_ptr<QPDFJob::PagesConfig> sVar2;
  allocator<char> local_39;
  string local_38;
  
  peVar1 = (in_RSI->o->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((peVar1->page_specs).super__Vector_base<QPDFJob::PageSpec,_std::allocator<QPDFJob::PageSpec>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      *(pointer *)
       ((long)&(peVar1->page_specs).
               super__Vector_base<QPDFJob::PageSpec,_std::allocator<QPDFJob::PageSpec>_>._M_impl.
               super__Vector_impl_data + 8)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"--pages may only be specified one time",&local_39);
    usage(&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  __p = (PagesConfig *)operator_new(8);
  __p->config = in_RSI;
  std::__shared_ptr<QPDFJob::PagesConfig,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<QPDFJob::PagesConfig,void>
            ((__shared_ptr<QPDFJob::PagesConfig,(__gnu_cxx::_Lock_policy)2> *)this,__p);
  sVar2.super___shared_ptr<QPDFJob::PagesConfig,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<QPDFJob::PagesConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<QPDFJob::PagesConfig>)
         sVar2.super___shared_ptr<QPDFJob::PagesConfig,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<QPDFJob::PagesConfig>
QPDFJob::Config::pages()
{
    if (!o.m->page_specs.empty()) {
        usage("--pages may only be specified one time");
    }
    return std::shared_ptr<PagesConfig>(new PagesConfig(this));
}